

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O0

bool slang::ast::Bitstream::canBeTarget
               (StreamingConcatenationExpression *lhs,Expression *rhs,SourceLocation assignLoc,
               ASTContext *context)

{
  SourceRange range;
  bool bVar1;
  Type *pTVar2;
  Diagnostic *pDVar3;
  StreamingConcatenationExpression *bitstream;
  string local_110;
  string local_e0;
  StreamingConcatenationExpression *local_c0;
  undefined4 local_b4;
  Diagnostic *local_b0;
  Diagnostic *diag;
  StreamingConcatenationExpression *source;
  size_t sStack_98;
  bool good;
  size_t sourceWidth;
  size_t targetWidth;
  SourceLocation local_80;
  SourceLocation local_78;
  SourceLocation local_70;
  undefined4 local_64;
  SourceRange *local_60;
  SourceRange *with;
  SourceRange *dynamic;
  SourceLocation local_48;
  StreamingConcatenationExpression *local_40;
  undefined4 local_34;
  ASTContext *local_30;
  ASTContext *context_local;
  Expression *rhs_local;
  StreamingConcatenationExpression *lhs_local;
  SourceLocation assignLoc_local;
  
  local_30 = context;
  context_local = (ASTContext *)rhs;
  rhs_local = &lhs->super_Expression;
  lhs_local = (StreamingConcatenationExpression *)assignLoc;
  if (rhs->kind != Streaming) {
    pTVar2 = not_null<const_slang::ast::Type_*>::operator->(&rhs->type);
    bVar1 = Type::isBitstreamType(pTVar2,false);
    if (!bVar1) {
      local_34 = 0x2d0007;
      local_40 = lhs_local;
      pDVar3 = ASTContext::addDiag(local_30,(DiagCode)0x2d0007,(SourceLocation)lhs_local);
      pTVar2 = not_null<const_slang::ast::Type_*>::operator*
                         ((not_null<const_slang::ast::Type_*> *)&context_local->lookupIndex);
      pDVar3 = ast::operator<<(pDVar3,pTVar2);
      dynamic = *(SourceRange **)&(rhs_local->sourceRange).startLoc;
      local_48 = (rhs_local->sourceRange).endLoc;
      Diagnostic::operator<<(pDVar3,rhs_local->sourceRange);
      return false;
    }
  }
  with = (SourceRange *)0x0;
  local_60 = (SourceRange *)0x0;
  bVar1 = withAfterDynamic((StreamingConcatenationExpression *)rhs_local,&with,&local_60);
  if (bVar1) {
    local_64 = 0x2f0007;
    local_78 = local_60->startLoc;
    local_70 = local_60->endLoc;
    pDVar3 = ASTContext::addDiag(local_30,(DiagCode)0x2f0007,*local_60);
    targetWidth = *(size_t *)&with->startLoc;
    local_80 = with->endLoc;
    Diagnostic::operator<<(pDVar3,*with);
    assignLoc_local._7_1_ = 0;
  }
  else {
    bVar1 = ASTContext::inUnevaluatedBranch(local_30);
    if (bVar1) {
      assignLoc_local._7_1_ = 1;
    }
    else {
      sourceWidth = StreamingConcatenationExpression::bitstreamWidth
                              ((StreamingConcatenationExpression *)rhs_local);
      source._7_1_ = 1;
      if (*(int *)&(context_local->scope).ptr == 0x11) {
        diag = (Diagnostic *)
               Expression::as<slang::ast::StreamingConcatenationExpression>
                         ((Expression *)context_local);
        sStack_98 = StreamingConcatenationExpression::bitstreamWidth
                              ((StreamingConcatenationExpression *)diag);
        bVar1 = StreamingConcatenationExpression::isFixedSize
                          ((StreamingConcatenationExpression *)rhs_local);
        if ((bVar1) &&
           (bVar1 = StreamingConcatenationExpression::isFixedSize
                              ((StreamingConcatenationExpression *)diag), bVar1)) {
          source._7_1_ = sourceWidth == sStack_98;
        }
        else {
          source._7_1_ = dynamicSizesMatch<slang::ast::StreamingConcatenationExpression,slang::ast::StreamingConcatenationExpression>
                                   ((StreamingConcatenationExpression *)rhs_local,
                                    (StreamingConcatenationExpression *)diag);
        }
      }
      else {
        pTVar2 = not_null<const_slang::ast::Type_*>::operator->
                           ((not_null<const_slang::ast::Type_*> *)&context_local->lookupIndex);
        bVar1 = Type::isFixedSize(pTVar2);
        if (!bVar1) {
          return true;
        }
        pTVar2 = not_null<const_slang::ast::Type_*>::operator->
                           ((not_null<const_slang::ast::Type_*> *)&context_local->lookupIndex);
        sStack_98 = Type::bitstreamWidth(pTVar2);
        source._7_1_ = sourceWidth <= sStack_98;
      }
      if ((bool)source._7_1_ == false) {
        local_b4 = 0x2b0007;
        local_c0 = lhs_local;
        pDVar3 = ASTContext::addDiag(local_30,(DiagCode)0x2b0007,(SourceLocation)lhs_local);
        local_b0 = pDVar3;
        if (*(int *)&(context_local->scope).ptr == 0x11) {
          formatWidth<slang::ast::StreamingConcatenationExpression>
                    (&local_e0,(StreamingConcatenationExpression *)rhs_local,DestFill);
          pDVar3 = Diagnostic::operator<<(pDVar3,&local_e0);
          bitstream = Expression::as<slang::ast::StreamingConcatenationExpression>
                                ((Expression *)context_local);
          formatWidth<slang::ast::StreamingConcatenationExpression>(&local_110,bitstream,Source);
          Diagnostic::operator<<(pDVar3,&local_110);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&local_e0);
        }
        else {
          pDVar3 = Diagnostic::operator<<(pDVar3,sourceWidth);
          Diagnostic::operator<<(pDVar3,sStack_98);
        }
        Diagnostic::operator<<(local_b0,rhs_local->sourceRange);
        if (*(int *)&(context_local->scope).ptr == 0x11) {
          range.startLoc = (SourceLocation)context_local->firstTempVar;
          range.endLoc = (SourceLocation)context_local->randomizeDetails;
          Diagnostic::operator<<(local_b0,range);
        }
      }
      assignLoc_local._7_1_ = source._7_1_ & 1;
    }
  }
  return (bool)assignLoc_local._7_1_;
}

Assistant:

bool Bitstream::canBeTarget(const StreamingConcatenationExpression& lhs, const Expression& rhs,
                            SourceLocation assignLoc, const ASTContext& context) {
    if (rhs.kind != ExpressionKind::Streaming && !rhs.type->isBitstreamType()) {
        context.addDiag(diag::BadStreamSourceType, assignLoc) << *rhs.type << lhs.sourceRange;
        return false;
    }

    const SourceRange *dynamic = nullptr, *with = nullptr;
    if (withAfterDynamic(lhs, dynamic, with)) {
        context.addDiag(diag::BadStreamWithOrder, *with) << *dynamic;
        return false;
    }

    if (context.inUnevaluatedBranch())
        return true; // No size check in an unevaluated conditional branch

    size_t targetWidth = lhs.bitstreamWidth();
    size_t sourceWidth;
    bool good = true;

    if (rhs.kind != ExpressionKind::Streaming) {
        if (!rhs.type->isFixedSize())
            return true; // Sizes checked at constant evaluation or runtime

        sourceWidth = rhs.type->bitstreamWidth();
        good = targetWidth <= sourceWidth;
    }
    else {
        auto& source = rhs.as<StreamingConcatenationExpression>();
        sourceWidth = source.bitstreamWidth();
        if (lhs.isFixedSize() && source.isFixedSize())
            good = targetWidth == sourceWidth;
        else
            good = dynamicSizesMatch(lhs, source);
    }

    if (!good) {
        auto& diag = context.addDiag(diag::BadStreamSize, assignLoc);
        if (rhs.kind != ExpressionKind::Streaming)
            diag << targetWidth << sourceWidth;
        else {
            diag << formatWidth(lhs, BitstreamSizeMode::DestFill)
                 << formatWidth(rhs.as<StreamingConcatenationExpression>(),
                                BitstreamSizeMode::Source);
        }

        diag << lhs.sourceRange;
        if (rhs.kind == ExpressionKind::Streaming)
            diag << rhs.sourceRange;
    }

    return good;
}